

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O3

SHMPTR SHMGetInfo(SHM_INFO_ID element)

{
  void *pvVar1;
  SHMPTR SVar2;
  
  if ((int)element < 3) {
    pvVar1 = (void *)pthread_self();
    if (locking_thread.m_val != pvVar1) {
      fprintf(_stderr,"] %s %s:%d","SHMGetInfo",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x392);
      fprintf(_stderr,"SHMGetInfo called while thread does not hold the SHM lock!\n");
    }
    SVar2 = *(SHMPTR *)((long)shm_segment_bases[0].m_val + (ulong)element * 8 + 0xa8);
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
  }
  else {
    SVar2 = 0;
    fprintf(_stderr,"] %s %s:%d","SHMGetInfo",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x38a);
    fprintf(_stderr,"Invalid SHM info element %d\n",(ulong)element);
  }
  return SVar2;
}

Assistant:

SHMPTR SHMGetInfo(SHM_INFO_ID element)
{
    SHM_FIRST_HEADER *header = NULL;
    SHMPTR retval = 0;

    if(element >= SIID_LAST)
    {
        ASSERT("Invalid SHM info element %d\n", element);
        return 0;
    }

    /* verify that this thread holds the SHM lock. No race condition: if the
       current thread is here, it can't be in SHMLock or SHMUnlock */
    if( (HANDLE)pthread_self() != locking_thread )
    {
        ASSERT("SHMGetInfo called while thread does not hold the SHM lock!\n");
    }

    header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

    retval = header->shm_info[element];

    TRACE("SHM info element %d is %08x\n", element, retval );
    return retval;
}